

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObjectData::~QObjectData(QObjectData *this)

{
  code *pcVar1;
  QObjectData *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

QObjectData::~QObjectData() {}